

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pzfmatrix.h
# Opt level: O1

TPZFMatrix<long_double> * __thiscall
TPZFMatrix<long_double>::operator*
          (TPZFMatrix<long_double> *__return_storage_ptr__,TPZFMatrix<long_double> *this,
          TPZFMatrix<long_double> *A)

{
  long lVar1;
  long lVar2;
  longdouble *plVar3;
  ulong uVar4;
  undefined8 in_R9;
  
  if ((this->super_TPZMatrix<long_double>).super_TPZBaseMatrix.fCol !=
      (A->super_TPZMatrix<long_double>).super_TPZBaseMatrix.fRow) {
    Error("Operator* <matrixs with incompatible dimensions>",(char *)0x0);
  }
  (__return_storage_ptr__->super_TPZMatrix<long_double>).super_TPZBaseMatrix.fRow = 0;
  (__return_storage_ptr__->super_TPZMatrix<long_double>).super_TPZBaseMatrix.fCol = 0;
  (__return_storage_ptr__->super_TPZMatrix<long_double>).super_TPZBaseMatrix.fDecomposed = '\0';
  (__return_storage_ptr__->super_TPZMatrix<long_double>).super_TPZBaseMatrix.fDefPositive = '\0';
  (__return_storage_ptr__->super_TPZMatrix<long_double>).super_TPZBaseMatrix.super_TPZSavable.
  _vptr_TPZSavable = (_func_int **)&PTR__TPZFMatrix_01845cc0;
  __return_storage_ptr__->fElem = (longdouble *)0x0;
  __return_storage_ptr__->fGiven = (longdouble *)0x0;
  __return_storage_ptr__->fSize = 0;
  TPZVec<int>::TPZVec(&(__return_storage_ptr__->fPivot).super_TPZVec<int>,0);
  (__return_storage_ptr__->fPivot).super_TPZVec<int>._vptr_TPZVec =
       (_func_int **)&PTR__TPZManVector_0183cde8;
  (__return_storage_ptr__->fPivot).super_TPZVec<int>.fStore =
       (__return_storage_ptr__->fPivot).fExtAlloc;
  (__return_storage_ptr__->fPivot).super_TPZVec<int>.fNElements = 0;
  (__return_storage_ptr__->fPivot).super_TPZVec<int>.fNAlloc = 0;
  (__return_storage_ptr__->fWork)._vptr_TPZVec = (_func_int **)&PTR__TPZVec_0183b530;
  (__return_storage_ptr__->fWork).fStore = (longdouble *)0x0;
  (__return_storage_ptr__->fWork).fNElements = 0;
  (__return_storage_ptr__->fWork).fNAlloc = 0;
  lVar1 = (this->super_TPZMatrix<long_double>).super_TPZBaseMatrix.fRow;
  lVar2 = (A->super_TPZMatrix<long_double>).super_TPZBaseMatrix.fCol;
  uVar4 = lVar2 * lVar1;
  if (uVar4 - (__return_storage_ptr__->super_TPZMatrix<long_double>).super_TPZBaseMatrix.fCol *
              (__return_storage_ptr__->super_TPZMatrix<long_double>).super_TPZBaseMatrix.fRow != 0)
  {
    plVar3 = __return_storage_ptr__->fElem;
    if ((plVar3 != (longdouble *)0x0) && (plVar3 != __return_storage_ptr__->fGiven)) {
      operator_delete__(plVar3);
    }
    plVar3 = __return_storage_ptr__->fGiven;
    if ((plVar3 == (longdouble *)0x0) ||
       (uVar4 - __return_storage_ptr__->fSize != 0 && __return_storage_ptr__->fSize <= (long)uVar4))
    {
      if (uVar4 == 0) {
        plVar3 = (longdouble *)0x0;
      }
      else {
        plVar3 = (longdouble *)operator_new__(-(ulong)(uVar4 >> 0x3c != 0) | uVar4 * 0x10);
      }
    }
    __return_storage_ptr__->fElem = plVar3;
    if (plVar3 == (longdouble *)0x0 && uVar4 != 0) {
      Error("Resize <memory allocation error>.",(char *)0x0);
    }
  }
  (__return_storage_ptr__->super_TPZMatrix<long_double>).super_TPZBaseMatrix.fRow = lVar1;
  (__return_storage_ptr__->super_TPZMatrix<long_double>).super_TPZBaseMatrix.fCol = lVar2;
  (*(__return_storage_ptr__->super_TPZMatrix<long_double>).super_TPZBaseMatrix.super_TPZSavable.
    _vptr_TPZSavable[0xf])(__return_storage_ptr__);
  (*(this->super_TPZMatrix<long_double>).super_TPZBaseMatrix.super_TPZSavable._vptr_TPZSavable[0x27]
  )(this,A,A,__return_storage_ptr__,0,in_R9,(longdouble)1,(longdouble)0);
  return __return_storage_ptr__;
}

Assistant:

inline TPZFMatrix<TVar> TPZFMatrix<TVar>::operator*(const TPZFMatrix<TVar> &A) const {
    if ( this->Cols() != A.Rows() )
        Error( "Operator* <matrixs with incompatible dimensions>" );
    
    TPZFMatrix<TVar> res;
    res.Redim( this->Rows(), A.Cols() );
    MultAdd(A,A,res,1.,0.,0);
    return( res );
}